

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::DictionaryPageHeader::read
          (DictionaryPageHeader *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _func_int **pp_Var5;
  undefined8 *puVar6;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int16_t fid;
  int32_t ecast66;
  TType ftype;
  string fname;
  short local_7a;
  undefined4 local_78;
  undefined4 local_74;
  type local_70;
  int local_6c;
  DictionaryPageHeader *local_68;
  int32_t *local_60;
  bool *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar1 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_58 = &this->is_sorted;
  local_60 = &this->num_values;
  local_74 = 0;
  local_78 = 0;
  local_68 = this;
  do {
    iVar2 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_6c,&local_7a);
    if (local_6c == 0) {
      iVar3 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if (((byte)local_74 & (byte)local_78 & 1) != 0) {
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
        return (ulong)(uint)(iVar3 + iVar2 + iVar1);
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
      puVar6[1] = puVar6 + 3;
      puVar6[2] = 0;
      *(undefined1 *)(puVar6 + 3) = 0;
      *puVar6 = &PTR__TException_019a5480;
      *(undefined4 *)(puVar6 + 5) = 1;
      __cxa_throw(puVar6,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                  duckdb_apache::thrift::TException::~TException);
    }
    if (local_7a == 3) {
      pp_Var5 = this_00->_vptr_TProtocol;
      if (local_6c == 2) {
        iVar3 = (*pp_Var5[0x23])(this_00,local_58);
        local_68->__isset = (_DictionaryPageHeader__isset)((byte)local_68->__isset | 1);
        goto LAB_0109f90d;
      }
LAB_0109f901:
      iVar3 = (*pp_Var5[0x2c])(this_00);
    }
    else if (local_7a == 2) {
      if (local_6c != 8) goto LAB_0109f8d8;
      iVar3 = (*this_00->_vptr_TProtocol[0x27])(this_00,&local_70);
      local_68->encoding = local_70;
      local_78 = (undefined4)CONCAT71((uint7)(uint3)(local_70 >> 8),1);
    }
    else {
      if (local_7a != 1) {
LAB_0109f8d8:
        pp_Var5 = this_00->_vptr_TProtocol;
        goto LAB_0109f901;
      }
      pp_Var5 = this_00->_vptr_TProtocol;
      if (local_6c != 8) goto LAB_0109f901;
      iVar3 = (*pp_Var5[0x27])(this_00,local_60);
      local_74 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    }
LAB_0109f90d:
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar1 = iVar3 + iVar2 + iVar1 + iVar4;
  } while( true );
}

Assistant:

uint32_t DictionaryPageHeader::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_num_values = false;
  bool isset_encoding = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->num_values);
          isset_num_values = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast66;
          xfer += iprot->readI32(ecast66);
          this->encoding = static_cast<Encoding::type>(ecast66);
          isset_encoding = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_BOOL) {
          xfer += iprot->readBool(this->is_sorted);
          this->__isset.is_sorted = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_num_values)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_encoding)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}